

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O1

void __thiscall ClParser_Int_Test::~ClParser_Int_Test(ClParser_Int_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ClParser, Int) {
    using pstore::maybe;
    using pstore::command_line::parser;
    {
        maybe<int> r1 = parser<int> () ("43");
        EXPECT_TRUE (r1.has_value ());
        EXPECT_EQ (r1.value (), 43);
    }
    {
        parser<int> p;
        maybe<int> r2 = p ("");
        EXPECT_FALSE (r2.has_value ());
    }
    {
        maybe<int> r3 = parser<int> () ("bad");
        EXPECT_FALSE (r3.has_value ());
    }
    {
        maybe<int> r4 = parser<int> () ("42bad");
        EXPECT_FALSE (r4.has_value ());
    }
}